

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::BreakpointEvent>::copyConstruct
          (BasicTypeInfo<dap::BreakpointEvent> *this,void *dst,void *src)

{
  BreakpointEvent::BreakpointEvent((BreakpointEvent *)dst,(BreakpointEvent *)src);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }